

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Parser::_rval_dash_start_or_continue_seq(Parser *this)

{
  State *pSVar1;
  size_t sVar2;
  char *pcVar3;
  code *pcVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  undefined1 uVar8;
  size_t sVar9;
  char *pcVar10;
  char msg [39];
  char local_68 [72];
  
  sVar9 = LineContents::current_col
                    (&this->m_state->line_contents,(this->m_state->line_contents).rem);
  if (sVar9 < this->m_state->indref) {
    builtin_strncpy(local_68,"check failed: (ind >= m_state->indref)",0x27);
    if ((s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar4 = (code *)swi(3);
        uVar8 = (*pcVar4)();
        return (bool)uVar8;
      }
    }
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6f0e) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x6f0e) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_68,0x27,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  pSVar1 = this->m_state;
  sVar2 = pSVar1->indref;
  pSVar1->flags = pSVar1->flags & 0xfffffe7fU | 0x100;
  if (sVar9 == sVar2) {
    if ((pSVar1->line_contents).full.len <= sVar9) {
      if ((s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar4 = (code *)swi(3);
          uVar8 = (*pcVar4)();
          return (bool)uVar8;
        }
      }
      handle_error(0x21a325,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x14c3,"i >= 0 && i < len");
    }
    pcVar10 = (pSVar1->line_contents).full.str + sVar9;
    pcVar3 = (this->m_buf).str;
    if ((pcVar10 < pcVar3) || (pcVar3 + (this->m_buf).len < pcVar10)) {
      builtin_strncpy(local_68 + 0x30,"buf.end())",0xb);
      builtin_strncpy(local_68 + 0x10,"tr >= m_buf.begin() && str <= m_",0x20);
      builtin_strncpy(local_68,"check failed: (s",0x10);
      if ((s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar4 = (code *)swi(3);
          uVar8 = (*pcVar4)();
          return (bool)uVar8;
        }
      }
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x5e95) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x5e95) << 0x40,8);
      LVar6.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar6.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_68,0x3b,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
    _append_val(this,(csubstr)ZEXT816(0),0);
  }
  else {
    _push_level(this,false);
    _start_seq(this,true);
    _save_indentation(this,0);
  }
  return sVar9 != sVar2;
}

Assistant:

bool Parser::_rval_dash_start_or_continue_seq()
{
    size_t ind = m_state->line_contents.current_col();
    _RYML_CB_ASSERT(m_stack.m_callbacks, ind >= m_state->indref);
    size_t delta_ind = ind - m_state->indref;
    if( ! delta_ind)
    {
        _c4dbgp("prev val was empty");
        addrem_flags(RNXT, RVAL);
        _append_val_null(&m_state->line_contents.full[ind]);
        return false;
    }
    _c4dbgp("val is a nested seq, indented");
    addrem_flags(RNXT, RVAL); // before _push_level!
    _push_level();
    _start_seq();
    _save_indentation();
    return true;
}